

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytestring_test.cc
# Opt level: O1

void __thiscall
anon_unknown.dwarf_18f9de::CBSTest_ASN1Uint64_Test::TestBody(CBSTest_ASN1Uint64_Test *this)

{
  bool *message;
  AssertHelper *pAVar1;
  CBS_ASN1_TAG tag;
  anon_union_32_2_4f6aaa2e_for_u *paVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  uint64_t value_00;
  unique_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  uVar4;
  internal iVar5;
  bool bVar6;
  int iVar7;
  undefined8 extraout_RAX;
  ulong uVar8;
  bool *pbVar9;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  _Var10;
  char *pcVar11;
  char *in_R9;
  long lVar12;
  ScopedTrace gtest_trace_936;
  AssertionResult gtest_ar__4;
  AssertionResult gtest_ar_;
  ScopedTrace gtest_trace_937;
  AssertionResult gtest_ar;
  UniquePtr<uint8_t> scoper;
  CBS cbs;
  int is_negative;
  size_t len;
  CBS child;
  uint8_t *out;
  UniquePtr<uint8_t> scoper_1;
  uint64_t value;
  ScopedTrace local_121;
  undefined1 local_120 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_118;
  undefined1 local_110 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_108;
  undefined1 local_100 [16];
  Bytes local_f0;
  ScopedTrace local_d9;
  undefined1 local_d8 [16];
  anon_union_32_2_4f6aaa2e_for_u local_c8;
  Bytes local_a8;
  undefined1 local_98 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_90;
  ScopedTrace local_84 [4];
  unique_ptr<unsigned_char,_bssl::internal::Deleter> local_80;
  CBS local_78;
  unique_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_60;
  _Head_base<0UL,_unsigned_char_*,_false> local_58;
  unique_ptr<unsigned_char,_bssl::internal::Deleter> local_50;
  bool *local_48;
  _Head_base<0UL,_unsigned_char_*,_false> local_40;
  ulong local_38;
  
  uVar8 = 0;
  pbVar9 = (bool *)0x0;
  do {
    message = pbVar9 + 0x6f3400;
    paVar2 = *(anon_union_32_2_4f6aaa2e_for_u **)(pbVar9 + 0x6f3408);
    pbVar3 = *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
              (pbVar9 + 0x6f3410);
    local_d8._0_8_ = paVar2;
    local_d8._8_8_ = pbVar3;
    local_48 = pbVar9;
    local_38 = uVar8;
    testing::ScopedTrace::ScopedTrace<Bytes>
              (&local_121,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
               ,0x3a8,(Bytes *)local_d8);
    testing::ScopedTrace::ScopedTrace<unsigned_long>
              (&local_d9,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
               ,0x3a9,(unsigned_long *)message);
    local_98 = (undefined1  [8])paVar2;
    local_90 = pbVar3;
    local_68._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )(__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )paVar2;
    iVar7 = CBS_get_asn1_uint64((CBS *)local_98,(uint64_t *)&local_40);
    local_110[0] = (internal)(iVar7 != 0);
    local_108 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (iVar7 == 0) {
      testing::Message::Message((Message *)&local_78);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_d8,(internal *)local_110,
                 (AssertionResult *)"CBS_get_asn1_uint64(&cbs, &value)","false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)local_120,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
                 ,0x3b0,(char *)local_d8._0_8_);
      testing::internal::AssertHelper::operator=((AssertHelper *)local_120,(Message *)&local_78);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_120);
      if ((anon_union_32_2_4f6aaa2e_for_u *)local_d8._0_8_ != &local_c8) {
        operator_delete((void *)local_d8._0_8_,(ulong)(local_c8.base.buf + 1));
      }
      _Var10._M_head_impl =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           CONCAT44(local_78.data._4_4_,local_78.data._0_4_);
LAB_0022003a:
      if ((anon_union_32_2_4f6aaa2e_for_u *)_Var10._M_head_impl !=
          (anon_union_32_2_4f6aaa2e_for_u *)0x0) {
        (**(code **)(*(long *)_Var10._M_head_impl + 8))();
      }
      if (local_108 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_108,local_108);
      }
LAB_002201e9:
      testing::ScopedTrace::~ScopedTrace(&local_d9);
      testing::ScopedTrace::~ScopedTrace(&local_121);
LAB_002201fd:
      if ((local_38 & 1) == 0) {
        return;
      }
      break;
    }
    local_78.data._0_4_ = 0;
    local_110 = (undefined1  [8])local_90;
    local_60 = pbVar3;
    testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
              ((internal *)local_d8,"0u","CBS_len(&cbs)",(uint *)&local_78,
               (unsigned_long *)local_110);
    if (local_d8[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_110);
      pcVar11 = "";
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d8._8_8_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar11 = ((_Alloc_hider *)local_d8._8_8_)->_M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_78,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
                 ,0x3b1,pcVar11);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_78,(Message *)local_110);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_78);
      if (local_110 != (undefined1  [8])0x0) {
        (**(code **)(*(long *)local_110 + 8))();
      }
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d8._8_8_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)(local_d8 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_d8._8_8_);
    }
    testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
              ((internal *)local_d8,"test.value","value",(unsigned_long *)message,
               (unsigned_long *)&local_40);
    if (local_d8[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_110);
      pcVar11 = "";
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d8._8_8_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar11 = ((_Alloc_hider *)local_d8._8_8_)->_M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_78,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
                 ,0x3b2,pcVar11);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_78,(Message *)local_110);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_78);
      if (local_110 != (undefined1  [8])0x0) {
        (**(code **)(*(long *)local_110 + 8))();
      }
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d8._8_8_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)(local_d8 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_d8._8_8_);
    }
    local_98 = (undefined1  [8])
               local_68._M_t.
               super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               .
               super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
               ._M_head_impl;
    local_90 = local_60;
    iVar7 = CBS_get_asn1((CBS *)local_98,&local_78,2);
    local_110[0] = (internal)(iVar7 != 0);
    local_108 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (iVar7 == 0) {
      testing::Message::Message((Message *)local_120);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_d8,(internal *)local_110,
                 (AssertionResult *)"CBS_get_asn1(&cbs, &child, 0x2u)","false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)(local_100 + 0x10),kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
                 ,0x3b7,(char *)local_d8._0_8_);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)(local_100 + 0x10),(Message *)local_120);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)(local_100 + 0x10));
      _Var10._M_head_impl =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_120;
      if ((anon_union_32_2_4f6aaa2e_for_u *)local_d8._0_8_ != &local_c8) {
        operator_delete((void *)local_d8._0_8_,(ulong)(local_c8.base.buf + 1));
        _Var10._M_head_impl =
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_120;
      }
      goto LAB_0022003a;
    }
    iVar7 = CBS_is_valid_asn1_integer(&local_78,(int *)local_84);
    local_110[0] = (internal)(iVar7 != 0);
    local_108 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (iVar7 == 0) {
      testing::Message::Message((Message *)local_120);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_d8,(internal *)local_110,
                 (AssertionResult *)"CBS_is_valid_asn1_integer(&child, &is_negative)","false","true"
                 ,in_R9);
      pAVar1 = (AssertHelper *)(local_100 + 0x10);
      testing::internal::AssertHelper::AssertHelper
                (pAVar1,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
                 ,0x3b8,(char *)local_d8._0_8_);
      testing::internal::AssertHelper::operator=(pAVar1,(Message *)local_120);
      testing::internal::AssertHelper::~AssertHelper(pAVar1);
      if ((anon_union_32_2_4f6aaa2e_for_u *)local_d8._0_8_ != &local_c8) {
        operator_delete((void *)local_d8._0_8_,(ulong)(local_c8.base.buf + 1));
      }
      if (local_120 != (undefined1  [8])0x0) {
        (**(code **)(*(long *)local_120 + 8))();
      }
    }
    if (local_108 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_108,local_108);
    }
    local_110 = (undefined1  [8])((ulong)local_110 & 0xffffffff00000000);
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)local_d8,"0","is_negative",(int *)local_110,(int *)local_84);
    if (local_d8[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_110);
      pcVar11 = "";
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d8._8_8_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar11 = ((_Alloc_hider *)local_d8._8_8_)->_M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)local_120,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
                 ,0x3b9,pcVar11);
      testing::internal::AssertHelper::operator=((AssertHelper *)local_120,(Message *)local_110);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_120);
      if (local_110 != (undefined1  [8])0x0) {
        (**(code **)(*(long *)local_110 + 8))();
      }
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d8._8_8_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)(local_d8 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_d8._8_8_);
    }
    iVar7 = CBS_is_unsigned_asn1_integer(&local_78);
    local_110[0] = (internal)(iVar7 != 0);
    local_108 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (iVar7 == 0) {
      testing::Message::Message((Message *)local_120);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_d8,(internal *)local_110,(AssertionResult *)0x53d0ff,"false","true"
                 ,in_R9);
      pAVar1 = (AssertHelper *)(local_100 + 0x10);
      testing::internal::AssertHelper::AssertHelper
                (pAVar1,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
                 ,0x3ba,(char *)local_d8._0_8_);
      testing::internal::AssertHelper::operator=(pAVar1,(Message *)local_120);
      testing::internal::AssertHelper::~AssertHelper(pAVar1);
      if ((anon_union_32_2_4f6aaa2e_for_u *)local_d8._0_8_ != &local_c8) {
        operator_delete((void *)local_d8._0_8_,(ulong)(local_c8.base.buf + 1));
      }
      if (local_120 != (undefined1  [8])0x0) {
        (**(code **)(*(long *)local_120 + 8))();
      }
    }
    if (local_108 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_108,local_108);
    }
    CBB_zero((CBB *)local_d8);
    iVar7 = CBB_init((CBB *)local_d8,0);
    local_120[0] = (internal)(iVar7 != 0);
    local_118 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (iVar7 == 0) {
      testing::Message::Message((Message *)(local_100 + 0x10));
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_110,(internal *)local_120,
                 (AssertionResult *)"CBB_init(cbb.get(), 0)","false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_a8,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
                 ,0x3be,(char *)local_110);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&local_a8,(Message *)(local_100 + 0x10));
LAB_00220192:
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_a8);
      if (local_110 != (undefined1  [8])local_100) {
        operator_delete((void *)local_110,(ulong)(local_100._0_8_ + 1));
      }
      if ((anon_union_32_2_4f6aaa2e_for_u *)local_f0.span_.data_ !=
          (anon_union_32_2_4f6aaa2e_for_u *)0x0) {
        (**(code **)(*(long *)local_f0.span_.data_ + 8))();
      }
      if (local_118 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_118,local_118);
      }
      CBB_cleanup((CBB *)local_d8);
      goto LAB_002201e9;
    }
    value_00 = *(uint64_t *)message;
    iVar7 = CBB_add_asn1_uint64((CBB *)local_d8,value_00);
    local_120[0] = (internal)(iVar7 != 0);
    local_118 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (iVar7 == 0) {
      testing::Message::Message((Message *)(local_100 + 0x10));
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_110,(internal *)local_120,
                 (AssertionResult *)"CBB_add_asn1_uint64(cbb.get(), test.value)","false","true",
                 in_R9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_a8,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
                 ,0x3bf,(char *)local_110);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&local_a8,(Message *)(local_100 + 0x10));
      goto LAB_00220192;
    }
    iVar7 = CBB_finish((CBB *)local_d8,&local_58._M_head_impl,(size_t *)&local_80);
    local_120[0] = (internal)(iVar7 != 0);
    local_118 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (iVar7 == 0) {
      testing::Message::Message((Message *)(local_100 + 0x10));
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_110,(internal *)local_120,
                 (AssertionResult *)"CBB_finish(cbb.get(), &out, &len)","false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_a8,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
                 ,0x3c0,(char *)local_110);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&local_a8,(Message *)(local_100 + 0x10));
      goto LAB_00220192;
    }
    local_a8.span_.data_ = local_58._M_head_impl;
    local_120 = (undefined1  [8])
                local_68._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl;
    local_118 = local_60;
    local_f0.span_.data_ = local_58._M_head_impl;
    local_f0.span_.size_ =
         (size_t)local_80._M_t.super___uniq_ptr_impl<unsigned_char,_bssl::internal::Deleter>._M_t.
                 super__Tuple_impl<0UL,_unsigned_char_*,_bssl::internal::Deleter>.
                 super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
    testing::internal::CmpHelperEQ<Bytes,Bytes>
              ((internal *)local_110,"Bytes(test.encoding, test.encoding_len)","Bytes(out, len)",
               (Bytes *)local_120,(Bytes *)(local_100 + 0x10));
    if (local_110[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_120);
      pcVar11 = "";
      if (local_108 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar11 = (local_108->_M_dataplus)._M_p;
      }
      pAVar1 = (AssertHelper *)(local_100 + 0x10);
      testing::internal::AssertHelper::AssertHelper
                (pAVar1,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
                 ,0x3c2,pcVar11);
      testing::internal::AssertHelper::operator=(pAVar1,(Message *)local_120);
      testing::internal::AssertHelper::~AssertHelper(pAVar1);
      if (local_120 != (undefined1  [8])0x0) {
        (**(code **)(*(long *)local_120 + 8))();
      }
    }
    if (local_108 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_108,local_108);
    }
    std::unique_ptr<unsigned_char,_bssl::internal::Deleter>::~unique_ptr
              ((unique_ptr<unsigned_char,_bssl::internal::Deleter> *)&local_a8);
    CBB_cleanup((CBB *)local_d8);
    CBB_zero((CBB *)local_d8);
    iVar7 = CBB_init((CBB *)local_d8,0);
    local_120[0] = (internal)(iVar7 != 0);
    local_118 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (iVar7 == 0) {
      testing::Message::Message((Message *)(local_100 + 0x10));
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_110,(internal *)local_120,
                 (AssertionResult *)"CBB_init(cbb.get(), 0)","false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_a8,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
                 ,0x3c8,(char *)local_110);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&local_a8,(Message *)(local_100 + 0x10));
LAB_0021fe8b:
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_a8);
      if (local_110 != (undefined1  [8])local_100) {
        operator_delete((void *)local_110,(ulong)(local_100._0_8_ + 1));
      }
      if ((anon_union_32_2_4f6aaa2e_for_u *)local_f0.span_.data_ !=
          (anon_union_32_2_4f6aaa2e_for_u *)0x0) {
        (**(code **)(*(long *)local_f0.span_.data_ + 8))();
      }
      if (local_118 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_118,local_118);
      }
      bVar6 = false;
    }
    else {
      iVar7 = CBB_add_asn1_uint64_with_tag((CBB *)local_d8,value_00,0x80000001);
      local_120[0] = (internal)(iVar7 != 0);
      local_118 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (iVar7 == 0) {
        testing::Message::Message((Message *)(local_100 + 0x10));
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_110,(internal *)local_120,
                   (AssertionResult *)
                   "CBB_add_asn1_uint64_with_tag(cbb.get(), test.value, (0x80u << 24) | 1)","false",
                   "true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_a8,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
                   ,0x3ca,(char *)local_110);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&local_a8,(Message *)(local_100 + 0x10));
        goto LAB_0021fe8b;
      }
      iVar7 = CBB_finish((CBB *)local_d8,&local_58._M_head_impl,(size_t *)&local_80);
      local_120[0] = (internal)(iVar7 != 0);
      local_118 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (iVar7 == 0) {
        testing::Message::Message((Message *)(local_100 + 0x10));
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_110,(internal *)local_120,
                   (AssertionResult *)"CBB_finish(cbb.get(), &out, &len)","false","true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_a8,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
                   ,0x3cb,(char *)local_110);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&local_a8,(Message *)(local_100 + 0x10));
        goto LAB_0021fe8b;
      }
      local_50._M_t.super___uniq_ptr_impl<unsigned_char,_bssl::internal::Deleter>._M_t.
      super__Tuple_impl<0UL,_unsigned_char_*,_bssl::internal::Deleter>.
      super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
           (__uniq_ptr_data<unsigned_char,_bssl::internal::Deleter,_true,_true>)
           (__uniq_ptr_data<unsigned_char,_bssl::internal::Deleter,_true,_true>)
           local_58._M_head_impl;
      std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<char_const*,void>
                ((vector<unsigned_char,std::allocator<unsigned_char>> *)local_110,
                 (char *)local_68._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl,
                 (char *)((long)(uint8_t **)
                                local_68._M_t.
                                super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                .
                                super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                ._M_head_impl + (long)&local_60->_M_dataplus),
                 (allocator_type *)local_120);
      *(char *)local_110 = -0x7f;
      local_f0.span_.size_ = (long)local_108 - (long)local_110;
      local_f0.span_.data_ = (uchar *)local_110;
      local_a8.span_.data_ = local_58._M_head_impl;
      local_a8.span_.size_ =
           (size_t)local_80._M_t.super___uniq_ptr_impl<unsigned_char,_bssl::internal::Deleter>._M_t.
                   super__Tuple_impl<0UL,_unsigned_char_*,_bssl::internal::Deleter>.
                   super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
      testing::internal::CmpHelperEQ<Bytes,Bytes>
                ((internal *)local_120,"Bytes(expected)","Bytes(out, len)",
                 (Bytes *)(local_100 + 0x10),&local_a8);
      if (local_120[0] == (internal)0x0) {
        testing::Message::Message((Message *)(local_100 + 0x10));
        pcVar11 = "";
        if (local_118 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar11 = (local_118->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_a8,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
                   ,0x3d0,pcVar11);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&local_a8,(Message *)(local_100 + 0x10));
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_a8);
        if ((anon_union_32_2_4f6aaa2e_for_u *)local_f0.span_.data_ !=
            (anon_union_32_2_4f6aaa2e_for_u *)0x0) {
          (**(code **)(*(long *)local_f0.span_.data_ + 8))();
        }
      }
      if (local_118 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_118,local_118);
      }
      if (local_110 != (undefined1  [8])0x0) {
        operator_delete((void *)local_110,local_100._0_8_ - (long)local_110);
      }
      std::unique_ptr<unsigned_char,_bssl::internal::Deleter>::~unique_ptr(&local_50);
      bVar6 = true;
    }
    CBB_cleanup((CBB *)local_d8);
    testing::ScopedTrace::~ScopedTrace(&local_d9);
    testing::ScopedTrace::~ScopedTrace(&local_121);
    if (!bVar6) goto LAB_002201fd;
    pbVar9 = local_48 + 0x18;
    uVar8 = CONCAT71((int7)((ulong)extraout_RAX >> 8),pbVar9 == (bool *)0xa8);
  } while (pbVar9 != (bool *)0xa8);
  pbVar9 = (bool *)&DAT_006f34c0;
  lVar12 = 0x78;
  pAVar1 = (AssertHelper *)(local_100 + 0x10);
  do {
    paVar2 = *(anon_union_32_2_4f6aaa2e_for_u **)(pbVar9 + -0x10);
    pbVar3 = *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)(pbVar9 + -8);
    local_d8._0_8_ = paVar2;
    local_d8._8_8_ = pbVar3;
    local_68._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )(__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )pbVar9;
    testing::ScopedTrace::ScopedTrace<Bytes>
              ((ScopedTrace *)&local_a8,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
               ,0x3d5,(Bytes *)local_d8);
    local_110 = (undefined1  [8])paVar2;
    local_108 = pbVar3;
    iVar7 = CBS_get_asn1_uint64((CBS *)local_110,(uint64_t *)&local_78);
    local_98[0] = (internal)(iVar7 == 0);
    local_90 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (iVar7 != 0) {
      testing::Message::Message((Message *)local_120);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_d8,(internal *)local_98,
                 (AssertionResult *)"CBS_get_asn1_uint64(&cbs, &value)","true","false",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (pAVar1,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
                 ,0x3da,(char *)local_d8._0_8_);
      testing::internal::AssertHelper::operator=(pAVar1,(Message *)local_120);
      testing::internal::AssertHelper::~AssertHelper(pAVar1);
      if ((anon_union_32_2_4f6aaa2e_for_u *)local_d8._0_8_ != &local_c8) {
        operator_delete((void *)local_d8._0_8_,(ulong)(local_c8.base.buf + 1));
      }
      if (local_120 != (undefined1  [8])0x0) {
        (**(code **)(*(long *)local_120 + 8))();
      }
    }
    if (local_90 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_90,local_90);
    }
    local_110 = (undefined1  [8])paVar2;
    local_108 = pbVar3;
    iVar7 = CBS_get_asn1((CBS *)local_110,(CBS *)local_d8,2);
    if (iVar7 != 0) {
      iVar7 = CBS_is_unsigned_asn1_integer((CBS *)local_d8);
      local_120[0] = (internal)(iVar7 != 0);
      testing::internal::CmpHelperEQ<bool,bool>
                ((internal *)local_98,"test.overflow","!!CBS_is_unsigned_asn1_integer(&child)",
                 (bool *)local_68._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl,(bool *)local_120);
      if (local_98[0] == (internal)0x0) {
        testing::Message::Message((Message *)local_120);
        pcVar11 = "";
        if (local_90 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar11 = (local_90->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (pAVar1,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
                   ,0x3df,pcVar11);
        testing::internal::AssertHelper::operator=(pAVar1,(Message *)local_120);
        testing::internal::AssertHelper::~AssertHelper(pAVar1);
        if (local_120 != (undefined1  [8])0x0) {
          (**(code **)(*(long *)local_120 + 8))();
        }
      }
      if (local_90 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_90,local_90);
      }
    }
    testing::ScopedTrace::~ScopedTrace((ScopedTrace *)&local_a8);
    pbVar9 = (bool *)((long)local_68._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl + 0x18);
    lVar12 = lVar12 + -0x18;
  } while (lVar12 != 0);
  pbVar9 = (bool *)0x0;
  do {
    uVar4._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         *(__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
           *)&((__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                *)(pbVar9 + 0x6f3540))->
              super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ;
    pbVar3 = *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
              (pbVar9 + 0x6f3548);
    local_d8._0_8_ =
         uVar4._M_t.
         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_t.
         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         .
         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         ._M_head_impl;
    local_d8._8_8_ = pbVar3;
    testing::ScopedTrace::ScopedTrace<Bytes>
              (local_84,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
               ,0x3e4,(Bytes *)local_d8);
    local_48 = pbVar9 + 0x6f3538;
    testing::ScopedTrace::ScopedTrace<unsigned_long>
              (&local_121,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
               ,0x3e5,(unsigned_long *)(pbVar9 + 0x6f3538));
    tag = *(CBS_ASN1_TAG *)(pbVar9 + 0x6f3530);
    local_98 = (undefined1  [8])
               uVar4._M_t.
               super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               .
               super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
               ._M_head_impl;
    local_90 = pbVar3;
    local_68._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )(__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )pbVar9;
    local_60 = pbVar3;
    iVar7 = CBS_get_asn1_uint64_with_tag((CBS *)local_98,(uint64_t *)&local_a8,tag);
    local_108 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (iVar7 == 0) {
      local_110[0] = (internal)(iVar7 != 0);
      testing::Message::Message((Message *)&local_78);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_d8,(internal *)local_110,
                 (AssertionResult *)"CBS_get_asn1_uint64_with_tag(&cbs, &value, test.tag)","false",
                 "true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)local_120,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
                 ,0x3ec,(char *)local_d8._0_8_);
      testing::internal::AssertHelper::operator=((AssertHelper *)local_120,(Message *)&local_78);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_120);
      if ((anon_union_32_2_4f6aaa2e_for_u *)local_d8._0_8_ != &local_c8) {
        operator_delete((void *)local_d8._0_8_,(ulong)(local_c8.base.buf + 1));
      }
      _Var10._M_head_impl =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           CONCAT44(local_78.data._4_4_,local_78.data._0_4_);
LAB_00220d2a:
      if ((anon_union_32_2_4f6aaa2e_for_u *)_Var10._M_head_impl !=
          (anon_union_32_2_4f6aaa2e_for_u *)0x0) {
        (**(code **)(*(long *)_Var10._M_head_impl + 8))();
      }
      if (local_108 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_108,local_108);
      }
      testing::ScopedTrace::~ScopedTrace(&local_121);
      testing::ScopedTrace::~ScopedTrace(local_84);
      return;
    }
    local_78.data._0_4_ = 0;
    local_110 = (undefined1  [8])local_90;
    testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
              ((internal *)local_d8,"0u","CBS_len(&cbs)",(uint *)&local_78,
               (unsigned_long *)local_110);
    if (local_d8[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_110);
      pcVar11 = "";
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d8._8_8_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar11 = ((_Alloc_hider *)local_d8._8_8_)->_M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_78,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
                 ,0x3ed,pcVar11);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_78,(Message *)local_110);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_78);
      if (local_110 != (undefined1  [8])0x0) {
        (**(code **)(*(long *)local_110 + 8))();
      }
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d8._8_8_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)(local_d8 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_d8._8_8_);
    }
    testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
              ((internal *)local_d8,"test.value","value",(unsigned_long *)local_48,
               (unsigned_long *)&local_a8);
    if (local_d8[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_110);
      pcVar11 = "";
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d8._8_8_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar11 = ((_Alloc_hider *)local_d8._8_8_)->_M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_78,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
                 ,0x3ee,pcVar11);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_78,(Message *)local_110);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_78);
      if (local_110 != (undefined1  [8])0x0) {
        (**(code **)(*(long *)local_110 + 8))();
      }
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d8._8_8_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)(local_d8 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_d8._8_8_);
    }
    local_90 = local_60;
    local_98 = (undefined1  [8])
               uVar4._M_t.
               super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               .
               super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
               ._M_head_impl;
    iVar7 = CBS_get_asn1((CBS *)local_98,&local_78,tag);
    iVar5 = (internal)(iVar7 != 0);
    local_108 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_110[0] = iVar5;
    if (iVar7 == 0) {
      testing::Message::Message((Message *)local_120);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_d8,(internal *)local_110,
                 (AssertionResult *)"CBS_get_asn1(&cbs, &child, test.tag)","false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)(local_100 + 0x10),kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
                 ,0x3f3,(char *)local_d8._0_8_);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)(local_100 + 0x10),(Message *)local_120);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)(local_100 + 0x10));
      _Var10._M_head_impl =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_120;
      if ((anon_union_32_2_4f6aaa2e_for_u *)local_d8._0_8_ != &local_c8) {
        operator_delete((void *)local_d8._0_8_,(ulong)(local_c8.base.buf + 1));
        _Var10._M_head_impl =
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_120;
      }
      goto LAB_00220d2a;
    }
    iVar7 = CBS_is_valid_asn1_integer(&local_78,(int *)&local_50);
    local_110[0] = (internal)(iVar7 != 0);
    local_108 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (iVar7 == 0) {
      testing::Message::Message((Message *)local_120);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_d8,(internal *)local_110,
                 (AssertionResult *)"CBS_is_valid_asn1_integer(&child, &is_negative)","false","true"
                 ,in_R9);
      pAVar1 = (AssertHelper *)(local_100 + 0x10);
      testing::internal::AssertHelper::AssertHelper
                (pAVar1,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
                 ,0x3f4,(char *)local_d8._0_8_);
      testing::internal::AssertHelper::operator=(pAVar1,(Message *)local_120);
      testing::internal::AssertHelper::~AssertHelper(pAVar1);
      if ((anon_union_32_2_4f6aaa2e_for_u *)local_d8._0_8_ != &local_c8) {
        operator_delete((void *)local_d8._0_8_,(ulong)(local_c8.base.buf + 1));
      }
      if (local_120 != (undefined1  [8])0x0) {
        (**(code **)(*(long *)local_120 + 8))();
      }
    }
    if (local_108 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_108,local_108);
    }
    local_110 = (undefined1  [8])((ulong)local_110 & 0xffffffff00000000);
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)local_d8,"0","is_negative",(int *)local_110,(int *)&local_50);
    if (local_d8[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_110);
      pcVar11 = "";
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d8._8_8_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar11 = ((_Alloc_hider *)local_d8._8_8_)->_M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)local_120,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
                 ,0x3f5,pcVar11);
      testing::internal::AssertHelper::operator=((AssertHelper *)local_120,(Message *)local_110);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_120);
      if (local_110 != (undefined1  [8])0x0) {
        (**(code **)(*(long *)local_110 + 8))();
      }
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d8._8_8_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)(local_d8 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_d8._8_8_);
    }
    iVar7 = CBS_is_unsigned_asn1_integer(&local_78);
    local_110[0] = (internal)(iVar7 != 0);
    local_108 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (iVar7 == 0) {
      testing::Message::Message((Message *)local_120);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_d8,(internal *)local_110,(AssertionResult *)0x53d0ff,"false","true"
                 ,in_R9);
      pAVar1 = (AssertHelper *)(local_100 + 0x10);
      testing::internal::AssertHelper::AssertHelper
                (pAVar1,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
                 ,0x3f6,(char *)local_d8._0_8_);
      testing::internal::AssertHelper::operator=(pAVar1,(Message *)local_120);
      testing::internal::AssertHelper::~AssertHelper(pAVar1);
      if ((anon_union_32_2_4f6aaa2e_for_u *)local_d8._0_8_ != &local_c8) {
        operator_delete((void *)local_d8._0_8_,(ulong)(local_c8.base.buf + 1));
      }
      if ((_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
           )local_120 !=
          (_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
           )0x0) {
        (**(code **)(*(long *)local_120 + 8))();
      }
    }
    if (local_108 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_108,local_108);
    }
    CBB_zero((CBB *)local_d8);
    iVar7 = CBB_init((CBB *)local_d8,0);
    local_120[0] = (internal)(iVar7 != 0);
    local_118 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (iVar7 == 0) {
      testing::Message::Message((Message *)(local_100 + 0x10));
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_110,(internal *)local_120,
                 (AssertionResult *)"CBB_init(cbb.get(), 0)","false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_80,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
                 ,0x3fa,(char *)local_110);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&local_80,(Message *)(local_100 + 0x10));
LAB_00220b72:
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_80);
      if (local_110 != (undefined1  [8])local_100) {
        operator_delete((void *)local_110,(ulong)(local_100._0_8_ + 1));
      }
      if ((anon_union_32_2_4f6aaa2e_for_u *)local_f0.span_.data_ !=
          (anon_union_32_2_4f6aaa2e_for_u *)0x0) {
        (**(code **)(*(long *)local_f0.span_.data_ + 8))();
      }
      if (local_118 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_118,local_118);
      }
      bVar6 = true;
    }
    else {
      iVar7 = CBB_add_asn1_uint64_with_tag
                        ((CBB *)local_d8,
                         *(uint64_t *)
                          ((long)local_68._M_t.
                                 super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 .
                                 super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                 ._M_head_impl + 0x6f3538),tag);
      local_120[0] = (internal)(iVar7 != 0);
      local_118 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (iVar7 == 0) {
        testing::Message::Message((Message *)(local_100 + 0x10));
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_110,(internal *)local_120,
                   (AssertionResult *)
                   "CBB_add_asn1_uint64_with_tag(cbb.get(), test.value, test.tag)","false","true",
                   in_R9);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_80,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
                   ,0x3fb,(char *)local_110);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&local_80,(Message *)(local_100 + 0x10));
        goto LAB_00220b72;
      }
      iVar7 = CBB_finish((CBB *)local_d8,&local_40._M_head_impl,(size_t *)&local_58);
      local_120[0] = (internal)(iVar7 != 0);
      local_118 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (iVar7 == 0) {
        testing::Message::Message((Message *)(local_100 + 0x10));
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_110,(internal *)local_120,
                   (AssertionResult *)"CBB_finish(cbb.get(), &out, &len)","false","true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_80,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
                   ,0x3fc,(char *)local_110);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&local_80,(Message *)(local_100 + 0x10));
        goto LAB_00220b72;
      }
      local_80._M_t.super___uniq_ptr_impl<unsigned_char,_bssl::internal::Deleter>._M_t.
      super__Tuple_impl<0UL,_unsigned_char_*,_bssl::internal::Deleter>.
      super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
           (__uniq_ptr_data<unsigned_char,_bssl::internal::Deleter,_true,_true>)
           (__uniq_ptr_data<unsigned_char,_bssl::internal::Deleter,_true,_true>)
           local_40._M_head_impl;
      local_118 = local_60;
      local_f0.span_.data_ = local_40._M_head_impl;
      local_f0.span_.size_ = (size_t)local_58._M_head_impl;
      local_120 = (undefined1  [8])
                  uVar4._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl;
      testing::internal::CmpHelperEQ<Bytes,Bytes>
                ((internal *)local_110,"Bytes(test.encoding, test.encoding_len)","Bytes(out, len)",
                 (Bytes *)local_120,(Bytes *)(local_100 + 0x10));
      if (local_110[0] == (internal)0x0) {
        testing::Message::Message((Message *)local_120);
        pcVar11 = "";
        if (local_108 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar11 = (local_108->_M_dataplus)._M_p;
        }
        pAVar1 = (AssertHelper *)(local_100 + 0x10);
        testing::internal::AssertHelper::AssertHelper
                  (pAVar1,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
                   ,0x3fe,pcVar11);
        testing::internal::AssertHelper::operator=(pAVar1,(Message *)local_120);
        testing::internal::AssertHelper::~AssertHelper(pAVar1);
        if (local_120 != (undefined1  [8])0x0) {
          (**(code **)(*(long *)local_120 + 8))();
        }
      }
      if (local_108 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_108,local_108);
      }
      std::unique_ptr<unsigned_char,_bssl::internal::Deleter>::~unique_ptr(&local_80);
      bVar6 = false;
    }
    CBB_cleanup((CBB *)local_d8);
    testing::ScopedTrace::~ScopedTrace(&local_121);
    testing::ScopedTrace::~ScopedTrace(local_84);
    pbVar9 = (bool *)((long)local_68._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl + 0x20);
    if (bVar6 || local_68._M_t.
                 super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 .
                 super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                 ._M_head_impl ==
                 (__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                  )&DAT_000000a0) {
      return;
    }
  } while( true );
}

Assistant:

TEST(CBSTest, ASN1Uint64) {
  for (const ASN1Uint64Test &test : kASN1Uint64Tests) {
    SCOPED_TRACE(Bytes(test.encoding, test.encoding_len));
    SCOPED_TRACE(test.value);
    CBS cbs;
    uint64_t value;
    uint8_t *out;
    size_t len;

    CBS_init(&cbs, (const uint8_t *)test.encoding, test.encoding_len);
    ASSERT_TRUE(CBS_get_asn1_uint64(&cbs, &value));
    EXPECT_EQ(0u, CBS_len(&cbs));
    EXPECT_EQ(test.value, value);

    CBS child;
    int is_negative;
    CBS_init(&cbs, (const uint8_t *)test.encoding, test.encoding_len);
    ASSERT_TRUE(CBS_get_asn1(&cbs, &child, CBS_ASN1_INTEGER));
    EXPECT_TRUE(CBS_is_valid_asn1_integer(&child, &is_negative));
    EXPECT_EQ(0, is_negative);
    EXPECT_TRUE(CBS_is_unsigned_asn1_integer(&child));

    {
      bssl::ScopedCBB cbb;
      ASSERT_TRUE(CBB_init(cbb.get(), 0));
      ASSERT_TRUE(CBB_add_asn1_uint64(cbb.get(), test.value));
      ASSERT_TRUE(CBB_finish(cbb.get(), &out, &len));
      bssl::UniquePtr<uint8_t> scoper(out);
      EXPECT_EQ(Bytes(test.encoding, test.encoding_len), Bytes(out, len));
    }

    {
      // Overwrite the tag.
      bssl::ScopedCBB cbb;
      ASSERT_TRUE(CBB_init(cbb.get(), 0));
      ASSERT_TRUE(CBB_add_asn1_uint64_with_tag(cbb.get(), test.value,
                                               CBS_ASN1_CONTEXT_SPECIFIC | 1));
      ASSERT_TRUE(CBB_finish(cbb.get(), &out, &len));
      bssl::UniquePtr<uint8_t> scoper(out);
      std::vector<uint8_t> expected(test.encoding,
                                    test.encoding + test.encoding_len);
      expected[0] = 0x81;
      EXPECT_EQ(Bytes(expected), Bytes(out, len));
    }
  }

  for (const ASN1InvalidUint64Test &test : kASN1InvalidUint64Tests) {
    SCOPED_TRACE(Bytes(test.encoding, test.encoding_len));
    CBS cbs;
    uint64_t value;

    CBS_init(&cbs, (const uint8_t *)test.encoding, test.encoding_len);
    EXPECT_FALSE(CBS_get_asn1_uint64(&cbs, &value));

    CBS_init(&cbs, (const uint8_t *)test.encoding, test.encoding_len);
    CBS child;
    if (CBS_get_asn1(&cbs, &child, CBS_ASN1_INTEGER)) {
      EXPECT_EQ(test.overflow, !!CBS_is_unsigned_asn1_integer(&child));
    }
  }

  for (const ASN1Uint64WithTagTest &test : kASN1Uint64WithTagTests) {
    SCOPED_TRACE(Bytes(test.encoding, test.encoding_len));
    SCOPED_TRACE(test.value);
    CBS cbs;
    uint64_t value;
    uint8_t *out;
    size_t len;

    CBS_init(&cbs, (const uint8_t *)test.encoding, test.encoding_len);
    ASSERT_TRUE(CBS_get_asn1_uint64_with_tag(&cbs, &value, test.tag));
    EXPECT_EQ(0u, CBS_len(&cbs));
    EXPECT_EQ(test.value, value);

    CBS child;
    int is_negative;
    CBS_init(&cbs, (const uint8_t *)test.encoding, test.encoding_len);
    ASSERT_TRUE(CBS_get_asn1(&cbs, &child, test.tag));
    EXPECT_TRUE(CBS_is_valid_asn1_integer(&child, &is_negative));
    EXPECT_EQ(0, is_negative);
    EXPECT_TRUE(CBS_is_unsigned_asn1_integer(&child));

    {
      bssl::ScopedCBB cbb;
      ASSERT_TRUE(CBB_init(cbb.get(), 0));
      ASSERT_TRUE(CBB_add_asn1_uint64_with_tag(cbb.get(), test.value, test.tag));
      ASSERT_TRUE(CBB_finish(cbb.get(), &out, &len));
      bssl::UniquePtr<uint8_t> scoper(out);
      EXPECT_EQ(Bytes(test.encoding, test.encoding_len), Bytes(out, len));
    }
  }
}